

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O2

uint64_t llvm::hashing::detail::hash_short(char *s,size_t length,uint64_t seed)

{
  byte bVar1;
  uint64_t uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  
  if (length - 4 < 5) {
    uVar2 = hash_16_bytes(length + (ulong)*(uint *)s * 8,*(uint *)(s + (length - 4)) ^ seed);
    return uVar2;
  }
  if (length - 9 < 8) {
    uVar7 = *(ulong *)(s + (length - 8));
    uVar3 = length + uVar7;
    bVar1 = (byte)length & 0x3f;
    uVar2 = hash_16_bytes(seed ^ *(ulong *)s,uVar3 >> bVar1 | uVar3 << 0x40 - bVar1);
    return uVar2 ^ uVar7;
  }
  if (length - 0x11 < 0x10) {
    uVar4 = *(long *)s * -0x4b6d499041670d8d - *(ulong *)(s + 8);
    uVar7 = *(ulong *)(s + 8) ^ 0xc949d7c7509e6557;
    uVar3 = *(long *)(s + (length - 8)) * -0x651e95c4d06fbfb1 ^ seed;
    uVar2 = hash_16_bytes((uVar3 << 0x22 | uVar3 >> 0x1e) +
                          (uVar4 * 0x200000 | uVar4 >> 0x2b) +
                          *(long *)(s + (length - 0x10)) * -0x3c5a37a36834ced9,
                          length + seed + *(long *)s * -0x4b6d499041670d8d +
                          (uVar7 << 0x2c | uVar7 >> 0x14) +
                          *(long *)(s + (length - 8)) * 0x651e95c4d06fbfb1);
    return uVar2;
  }
  if (length < 0x21) {
    if (length == 0) {
      return seed ^ 0x9ae16a3b2f90404f;
    }
    uVar7 = (ulong)((int)length + (uint)(byte)s[length - 1] * 4) * -0x36b62838af619aa9 ^ seed ^
            (ulong)CONCAT11(s[length >> 1],*s) * -0x651e95c4d06fbfb1;
    return (uVar7 >> 0x2f ^ uVar7) * -0x651e95c4d06fbfb1;
  }
  uVar8 = (*(long *)(s + (length - 0x10)) + length) * -0x3c5a37a36834ced9 + *(long *)s;
  uVar7 = uVar8 + *(long *)(s + 0x18);
  uVar9 = uVar8 + *(long *)(s + 8);
  uVar10 = uVar9 + *(long *)(s + 0x10);
  uVar4 = *(long *)(s + 0x10) + *(long *)(s + (length - 0x20));
  uVar3 = uVar4 + *(long *)(s + (length - 8));
  uVar5 = uVar4 + *(long *)(s + (length - 0x18));
  uVar6 = uVar5 + *(long *)(s + (length - 0x10));
  lVar11 = (uVar10 << 0x21 | uVar10 >> 0x1f) +
           (uVar9 << 0x39 | uVar9 >> 7) + (uVar8 * 0x8000000 | uVar8 >> 0x25) +
           (uVar7 * 0x1000 | uVar7 >> 0x34);
  uVar7 = (*(long *)(s + (length - 8)) + uVar6 + lVar11) * -0x3c5a37a36834ced9 +
          ((uVar4 * 0x8000000 | uVar4 >> 0x25) + *(long *)(s + 0x18) +
           (uVar3 * 0x1000 | uVar3 >> 0x34) + (uVar5 << 0x39 | uVar5 >> 7) +
           (uVar6 << 0x21 | uVar6 >> 0x1f) + uVar10) * -0x651e95c4d06fbfb1;
  uVar7 = ((uVar7 >> 0x2f ^ uVar7) * -0x3c5a37a36834ced9 ^ seed) + lVar11;
  return (uVar7 >> 0x2f ^ uVar7) * -0x651e95c4d06fbfb1;
}

Assistant:

inline uint64_t hash_short(const char *s, size_t length, uint64_t seed) {
  if (length >= 4 && length <= 8)
    return hash_4to8_bytes(s, length, seed);
  if (length > 8 && length <= 16)
    return hash_9to16_bytes(s, length, seed);
  if (length > 16 && length <= 32)
    return hash_17to32_bytes(s, length, seed);
  if (length > 32)
    return hash_33to64_bytes(s, length, seed);
  if (length != 0)
    return hash_1to3_bytes(s, length, seed);

  return k2 ^ seed;
}